

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionChannel::detectPipeliningSupport(QHttpNetworkConnectionChannel *this)

{
  storage_type *psVar1;
  qsizetype qVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  SocketState SVar6;
  long lVar7;
  uint uVar8;
  QArrayData *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  anon_class_1_0_00000001 getState;
  QArrayData *local_68;
  QArrayData *local_50;
  storage_type *psStack_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (**(code **)(**(long **)(this + 0x38) + 0x70))();
  if (iVar5 == 1) {
    iVar5 = (**(code **)(**(long **)(this + 0x38) + 0x78))();
    if (iVar5 == 1) {
      bVar3 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled
                        (*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
      if (!bVar3) {
        local_50 = (QArrayData *)CONCAT71(local_50._1_7_,0xaa);
        SVar6 = QSocketAbstraction::
                visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                          ((anon_class_1_0_00000001 *)&local_50,*(QIODevice **)(this + 0x10));
        if (SVar6 == ConnectedState) {
          uVar8 = 0;
          local_68 = (QArrayData *)0x0;
          (**(code **)(**(long **)(this + 0x38) + 0x98))
                    (&local_50,*(long **)(this + 0x38),6,"Server");
          qVar2 = local_40;
          psVar1 = psStack_48;
          pQVar9 = local_50;
          local_50 = (QArrayData *)0x0;
          psStack_48 = (storage_type *)0x0;
          local_40 = 0;
          QVar10.m_data = psVar1;
          QVar10.m_size = qVar2;
          QVar16.m_data = "Microsoft-IIS/4.";
          QVar16.m_size = 0x10;
          lVar7 = QtPrivate::findByteArray(QVar10,0,QVar16);
          bVar3 = true;
          if (lVar7 == -1) {
            uVar8 = 0;
            QVar11.m_data = psVar1;
            QVar11.m_size = qVar2;
            QVar17.m_data = "Microsoft-IIS/5.";
            QVar17.m_size = 0x10;
            lVar7 = QtPrivate::findByteArray(QVar11,0,QVar17);
            if (lVar7 == -1) {
              uVar8 = 0;
              QVar12.m_data = psVar1;
              QVar12.m_size = qVar2;
              QVar18.m_data = "Netscape-Enterprise/3.";
              QVar18.m_size = 0x16;
              lVar7 = QtPrivate::findByteArray(QVar12,0,QVar18);
              if (lVar7 == -1) {
                uVar8 = 0;
                QVar13.m_data = psVar1;
                QVar13.m_size = qVar2;
                QVar19.m_data = "WebLogic";
                QVar19.m_size = 8;
                lVar7 = QtPrivate::findByteArray(QVar13,0,QVar19);
                if (lVar7 == -1) {
                  QVar14.m_data = psVar1;
                  QVar14.m_size = qVar2;
                  QVar15.m_data = "Rocket";
                  QVar15.m_size = 6;
                  bVar4 = QtPrivate::startsWith(QVar14,QVar15);
                  uVar8 = (uint)(bVar4 ^ 1);
                }
              }
            }
          }
          goto LAB_002099ce;
        }
      }
    }
  }
  pQVar9 = (QArrayData *)0x0;
  bVar3 = false;
  uVar8 = 0;
LAB_002099ce:
  if (bVar3) {
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,1,0x10);
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,1,0x10);
      }
    }
  }
  *(uint *)(this + 0xb0) = uVar8;
  if (pQVar9 != (QArrayData *)0x0) {
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar9,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::detectPipeliningSupport()
{
    Q_ASSERT(reply);
    // detect HTTP Pipelining support
    QByteArray serverHeaderField;
    if (
            // check for HTTP/1.1
            (reply->majorVersion() == 1 && reply->minorVersion() == 1)
            // check for not having connection close
            && (!reply->d_func()->isConnectionCloseEnabled())
            // check if it is still connected
            && (QSocketAbstraction::socketState(socket) == QAbstractSocket::ConnectedState)
            // check for broken servers in server reply header
            // this is adapted from http://mxr.mozilla.org/firefox/ident?i=SupportsPipelining
            && (serverHeaderField = reply->headerField("Server"), !serverHeaderField.contains("Microsoft-IIS/4."))
            && (!serverHeaderField.contains("Microsoft-IIS/5."))
            && (!serverHeaderField.contains("Netscape-Enterprise/3."))
            // this is adpoted from the knowledge of the Nokia 7.x browser team (DEF143319)
            && (!serverHeaderField.contains("WebLogic"))
            && (!serverHeaderField.startsWith("Rocket")) // a Python Web Server, see Web2py.com
            ) {
        pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningProbablySupported;
    } else {
        pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningSupportUnknown;
    }
}